

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

void __thiscall
t_rs_generator::render_struct_default_trait_impl
          (t_rs_generator *this,string *struct_name,t_struct *tstruct)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  t_field *ptVar3;
  pointer pptVar4;
  ostream *poVar5;
  t_rs_generator *this_00;
  string member_name;
  string local_98;
  t_rs_generator *local_78;
  string local_70;
  string local_50;
  
  pptVar4 = (tstruct->members_in_id_order_).
            super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (pptVar4 ==
        (tstruct->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      poVar1 = &this->f_gen_;
      poVar5 = std::operator<<((ostream *)poVar1,"impl Default for ");
      poVar5 = std::operator<<(poVar5,(string *)struct_name);
      poVar5 = std::operator<<(poVar5," {");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      piVar2 = &(this->super_t_generator).indent_;
      *piVar2 = *piVar2 + 1;
      t_generator::indent_abi_cxx11_(&local_98,&this->super_t_generator);
      poVar5 = std::operator<<((ostream *)poVar1,(string *)&local_98);
      poVar5 = std::operator<<(poVar5,"fn default() -> Self {");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_98);
      piVar2 = &(this->super_t_generator).indent_;
      *piVar2 = *piVar2 + 1;
      if ((tstruct->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (tstruct->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        t_generator::indent_abi_cxx11_(&local_98,&this->super_t_generator);
        poVar5 = std::operator<<((ostream *)poVar1,(string *)&local_98);
        poVar5 = std::operator<<(poVar5,(string *)struct_name);
        poVar5 = std::operator<<(poVar5,"{}");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      }
      else {
        t_generator::indent_abi_cxx11_(&local_98,&this->super_t_generator);
        poVar5 = std::operator<<((ostream *)poVar1,(string *)&local_98);
        poVar5 = std::operator<<(poVar5,(string *)struct_name);
        poVar5 = std::operator<<(poVar5,"{");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_98);
        piVar2 = &(this->super_t_generator).indent_;
        *piVar2 = *piVar2 + 1;
        local_78 = this;
        for (pptVar4 = (tstruct->members_in_id_order_).
                       super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                       super__Vector_impl_data._M_start; this = local_78,
            pptVar4 !=
            (tstruct->members_in_id_order_).
            super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
          ptVar3 = *pptVar4;
          rust_field_name_abi_cxx11_(&local_98,local_78,ptVar3);
          t_generator::indent_abi_cxx11_(&local_50,&this->super_t_generator);
          poVar5 = std::operator<<((ostream *)poVar1,(string *)&local_50);
          poVar5 = std::operator<<(poVar5,(string *)&local_98);
          this_00 = (t_rs_generator *)0x2ed668;
          poVar5 = std::operator<<(poVar5,": ");
          opt_in_req_out_value_abi_cxx11_(&local_70,this_00,ptVar3->type_);
          poVar5 = std::operator<<(poVar5,(string *)&local_70);
          poVar5 = std::operator<<(poVar5,",");
          std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_98);
        }
        piVar2 = &(local_78->super_t_generator).indent_;
        *piVar2 = *piVar2 + -1;
        t_generator::indent_abi_cxx11_(&local_98,&local_78->super_t_generator);
        poVar5 = std::operator<<((ostream *)poVar1,(string *)&local_98);
        poVar5 = std::operator<<(poVar5,"}");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      }
      std::__cxx11::string::~string((string *)&local_98);
      piVar2 = &(this->super_t_generator).indent_;
      *piVar2 = *piVar2 + -1;
      t_generator::indent_abi_cxx11_(&local_98,&this->super_t_generator);
      poVar5 = std::operator<<((ostream *)poVar1,(string *)&local_98);
      poVar5 = std::operator<<(poVar5,"}");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_98);
      piVar2 = &(this->super_t_generator).indent_;
      *piVar2 = *piVar2 + -1;
      poVar5 = std::operator<<((ostream *)poVar1,"}");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::operator<<((ostream *)poVar1,(string *)&::endl_abi_cxx11_);
      return;
    }
    ptVar3 = *pptVar4;
    pptVar4 = pptVar4 + 1;
  } while (ptVar3->req_ - T_OPTIONAL < 2);
  return;
}

Assistant:

void t_rs_generator::render_struct_default_trait_impl(const string& struct_name, t_struct* tstruct) {
  bool has_required_field = false;

  const vector<t_field*>& members = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator members_iter;
  for (members_iter = members.begin(); members_iter != members.end(); ++members_iter) {
    t_field* member = *members_iter;
    if (!is_optional(member->get_req())) {
      has_required_field = true;
      break;
    }
  }

  if (has_required_field) {
    return;
  }

  f_gen_ << "impl Default for " << struct_name << " {" << endl;
  indent_up();
  f_gen_ << indent() << "fn default() -> Self {" << endl;
  indent_up();

  if (members.empty()) {
    f_gen_ << indent() << struct_name << "{}" << endl;
  } else {
    f_gen_ << indent() << struct_name << "{" << endl;
    indent_up();
    for (members_iter = members.begin(); members_iter != members.end(); ++members_iter) {
      t_field *member = (*members_iter);
      string member_name(rust_field_name(member));
      f_gen_ << indent() << member_name << ": " << opt_in_req_out_value(member->get_type()) << "," << endl;
    }
    indent_down();
    f_gen_ << indent() << "}" << endl;
  }

  indent_down();
  f_gen_ << indent() << "}" << endl;
  indent_down();
  f_gen_ << "}" << endl;
  f_gen_ << endl;
}